

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldStringAccessor::Swap
          (RepeatedPtrFieldStringAccessor *this,Field *data,RepeatedFieldAccessor *other_mutator,
          Field *other_data)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int index;
  ulong uVar4;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tmp;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((RepeatedFieldAccessor *)this != other_mutator) {
    local_68.super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
    local_68.super_RepeatedPtrFieldBase.current_size_ = 0;
    local_68.super_RepeatedPtrFieldBase.total_size_ = 0;
    local_68.super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Swap(&local_68,
           (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)data);
    iVar2 = (*other_mutator->_vptr_RepeatedFieldAccessor[1])(other_mutator,other_data);
    index = 0;
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    for (; iVar2 != index; index = index + 1) {
      RepeatedFieldAccessor::Get<std::__cxx11::string>(&local_50,other_mutator,other_data,index);
      RepeatedFieldAccessor::Add<std::__cxx11::string,std::__cxx11::string>
                ((RepeatedFieldAccessor *)this,data,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    uVar1 = *(uint *)((long)data + 8);
    (*other_mutator->_vptr_RepeatedFieldAccessor[3])(other_mutator,other_data);
    uVar3 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar3;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      RepeatedFieldAccessor::Add<std::__cxx11::string,std::__cxx11::string>
                (other_mutator,other_data,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_68.super_RepeatedPtrFieldBase.rep_)->elements[uVar3]);
    }
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~RepeatedPtrField(&local_68);
    return;
  }
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Swap((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)data,(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)other_data);
  return;
}

Assistant:

void Swap(Field* data, const internal::RepeatedFieldAccessor* other_mutator,
            Field* other_data) const override {
    if (this == other_mutator) {
      MutableRepeatedField(data)->Swap(MutableRepeatedField(other_data));
    } else {
      RepeatedPtrField<std::string> tmp;
      tmp.Swap(MutableRepeatedField(data));
      int other_size = other_mutator->Size(other_data);
      for (int i = 0; i < other_size; ++i) {
        Add<std::string>(data, other_mutator->Get<std::string>(other_data, i));
      }
      int size = Size(data);
      other_mutator->Clear(other_data);
      for (int i = 0; i < size; ++i) {
        other_mutator->Add<std::string>(other_data, tmp.Get(i));
      }
    }
  }